

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nqueens.c
# Opt level: O0

void print_help(void)

{
  printf("Usage: nqueens [OPTION...] <size>\n\n");
  printf("  -w, --workers <workers>    Number of workers (default = 0: autodetect)\n");
  printf("      --report-minor         Report minor steps\n");
  printf("      --report-minterms      Report #minterms at every major step\n");
  printf("      --report-stats         Report statistics at end\n");
  printf("  -h, --help                 Give this help list\n");
  printf("      --usage                Give a short usage message\n");
  return;
}

Assistant:

static void
print_help()
{
    printf("Usage: nqueens [OPTION...] <size>\n\n");
    printf("  -w, --workers <workers>    Number of workers (default = 0: autodetect)\n");
    printf("      --report-minor         Report minor steps\n");
    printf("      --report-minterms      Report #minterms at every major step\n");
    printf("      --report-stats         Report statistics at end\n");
    printf("  -h, --help                 Give this help list\n");
    printf("      --usage                Give a short usage message\n");
}